

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O3

int wait_for_socket_connection(SOCKET_IO_INSTANCE *socket_io_instance)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  LOGGER_LOG p_Var4;
  char *pcVar5;
  int so_error;
  socklen_t len;
  timeval tv;
  fd_set fdset;
  int local_c0 [2];
  timeval local_b8;
  fd_set local_a8;
  
  local_a8.fds_bits[0] = 0;
  local_a8.fds_bits[1] = 0;
  local_a8.fds_bits[2] = 0;
  local_a8.fds_bits[3] = 0;
  local_a8.fds_bits[4] = 0;
  local_a8.fds_bits[5] = 0;
  local_a8.fds_bits[6] = 0;
  local_a8.fds_bits[7] = 0;
  local_a8.fds_bits[8] = 0;
  local_a8.fds_bits[9] = 0;
  local_a8.fds_bits[10] = 0;
  local_a8.fds_bits[0xb] = 0;
  local_a8.fds_bits[0xc] = 0;
  local_a8.fds_bits[0xd] = 0;
  local_a8.fds_bits[0xe] = 0;
  local_a8.fds_bits[0xf] = 0;
  iVar2 = socket_io_instance->socket;
  iVar1 = iVar2 + 0x3f;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  local_a8.fds_bits[iVar1 >> 6] =
       local_a8.fds_bits[iVar1 >> 6] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
  local_b8.tv_sec = 10;
  local_b8.tv_usec = 0;
  do {
    iVar2 = select(socket_io_instance->socket + 1,(fd_set *)0x0,&local_a8,(fd_set *)0x0,&local_b8);
    if (-1 < iVar2) {
      if (iVar2 == 1) {
        local_c0[0] = 0;
        local_c0[1] = 4;
        iVar2 = getsockopt(socket_io_instance->socket,1,4,local_c0,(socklen_t *)(local_c0 + 1));
        if (iVar2 != 0) {
          p_Var4 = xlogging_get_log_function();
          iVar2 = 0x2b6;
          if (p_Var4 != (LOGGER_LOG)0x0) {
            piVar3 = __errno_location();
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                      ,"wait_for_socket_connection",0x2b5,1,"Failure: getsockopt failure %d.",
                      *piVar3);
          }
          goto LAB_0010fd1c;
        }
        if (local_c0[0] == 0) {
          return 0;
        }
        p_Var4 = xlogging_get_log_function();
        iVar2 = 700;
        if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0010fd1c;
        pcVar5 = "Failure: connect failure %d.";
        iVar1 = 699;
        goto LAB_0010fd11;
      }
      break;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  p_Var4 = xlogging_get_log_function();
  iVar2 = 0x2ac;
  if (p_Var4 != (LOGGER_LOG)0x0) {
    pcVar5 = "Failure: select failure.";
    iVar1 = 0x2ab;
LAB_0010fd11:
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
              ,"wait_for_socket_connection",iVar1,1,pcVar5);
  }
LAB_0010fd1c:
  if (-1 < socket_io_instance->socket) {
    close(socket_io_instance->socket);
  }
  socket_io_instance->socket = -1;
  return iVar2;
}

Assistant:

static int wait_for_socket_connection(SOCKET_IO_INSTANCE* socket_io_instance)
{
    int result;
    int err;
    int retval;
    int select_errno = 0;

    fd_set fdset;
    struct timeval tv;

    FD_ZERO(&fdset);
    FD_SET(socket_io_instance->socket, &fdset);
    tv.tv_sec = CONNECT_TIMEOUT;
    tv.tv_usec = 0;

    do
    {
        retval = select(socket_io_instance->socket + 1, NULL, &fdset, NULL, &tv);

        if (retval < 0)
        {
            select_errno = errno;
        }
    } while (retval < 0 && select_errno == EINTR);

    if (retval != 1)
    {
        LogError("Failure: select failure.");
        result = MU_FAILURE;
    }
    else
    {
        int so_error = 0;
        socklen_t len = sizeof(so_error);
        err = getsockopt(socket_io_instance->socket, SOL_SOCKET, SO_ERROR, &so_error, &len);
        if (err != 0)
        {
            LogError("Failure: getsockopt failure %d.", errno);
            result = MU_FAILURE;
        }
        else if (so_error != 0)
        {
            err = so_error;
            LogError("Failure: connect failure %d.", so_error);
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }

    if (result != 0)
    {
        if (socket_io_instance->socket >= SOCKET_SUCCESS)
        {
            close(socket_io_instance->socket);
        }
        socket_io_instance->socket = INVALID_SOCKET;
    }

    return result;
}